

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O2

void capnp::compiler::anon_unknown_0::checkExampleField
               (Reader reader,Field field,uint sharedOrdinalCount)

{
  Reader type;
  Reader reader_00;
  Field field_00;
  uint ordinal;
  uint sharedOrdinalCount_00;
  Reader *this;
  ReaderFor<DynamicStruct> local_130;
  Reader local_f8;
  SegmentReader *local_c8;
  undefined8 in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff64;
  undefined1 in_stack_ffffffffffffff68 [24];
  Reader local_78;
  
  if (0x4f < field.proto._reader.dataSize) {
    if (*(short *)((long)field.proto._reader.data + 8) == 1) {
      DynamicStruct::Reader::get((Reader *)&local_c8,&reader,field);
      DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                (&local_130,(Reader *)&local_c8);
      reader_00.reader.segment = local_130.reader.segment;
      reader_00.schema.super_Schema.raw = local_130.schema.super_Schema.raw;
      reader_00.reader.capTable = local_130.reader.capTable;
      reader_00.reader.data = local_130.reader.data;
      reader_00.reader.pointers = local_130.reader.pointers;
      reader_00.reader.dataSize = local_130.reader.dataSize;
      reader_00.reader.pointerCount = local_130.reader.pointerCount;
      reader_00.reader._38_2_ = local_130.reader._38_2_;
      reader_00.reader.nestingLimit = local_130.reader.nestingLimit;
      reader_00.reader._44_4_ = local_130.reader._44_4_;
      checkExampleStruct(reader_00,sharedOrdinalCount);
      this = (Reader *)&local_c8;
      goto LAB_0016c9ac;
    }
    if (*(short *)((long)field.proto._reader.data + 8) != 0) {
      return;
    }
  }
  field_00._8_8_ = in_stack_ffffffffffffff48;
  field_00.parent.super_Schema.raw = (Schema)(Schema)in_stack_ffffffffffffff40;
  field_00.proto._reader.segment = (SegmentReader *)in_stack_ffffffffffffff50;
  field_00.proto._reader.capTable._0_4_ = in_stack_ffffffffffffff58;
  field_00.proto._reader._12_8_ = in_stack_ffffffffffffff5c;
  field_00.proto._reader.data._4_4_ = in_stack_ffffffffffffff64;
  field_00.proto._reader._24_24_ = in_stack_ffffffffffffff68;
  ordinal = getOrdinal(field_00);
  if (sharedOrdinalCount <= ordinal) {
    return;
  }
  DynamicStruct::Reader::get(&local_78,&reader,field);
  local_c8 = field.proto._reader.segment;
  capnp::schema::Field::Slot::Reader::getType(&local_f8,(Reader *)&local_c8);
  type._reader.capTable = local_f8._reader.capTable;
  type._reader.segment = local_f8._reader.segment;
  type._reader.data = local_f8._reader.data;
  type._reader.pointers = local_f8._reader.pointers;
  type._reader.dataSize = local_f8._reader.dataSize;
  type._reader.pointerCount = local_f8._reader.pointerCount;
  type._reader._38_2_ = local_f8._reader._38_2_;
  type._reader.nestingLimit = local_f8._reader.nestingLimit;
  type._reader._44_4_ = local_f8._reader._44_4_;
  checkExampleValue(&local_78,ordinal,type,sharedOrdinalCount_00);
  this = &local_78;
LAB_0016c9ac:
  DynamicValue::Reader::~Reader(this);
  return;
}

Assistant:

void checkExampleField(DynamicStruct::Reader reader, StructSchema::Field field,
                       uint sharedOrdinalCount) {
  auto fieldProto = field.getProto();
  switch (fieldProto.which()) {
    case schema::Field::SLOT: {
      uint ordinal = getOrdinal(field);
      if (ordinal < sharedOrdinalCount) {
        checkExampleValue(reader.get(field), ordinal,
                          fieldProto.getSlot().getType(), sharedOrdinalCount);
      }
      break;
    }
    case schema::Field::GROUP:
      checkExampleStruct(reader.get(field).as<DynamicStruct>(), sharedOrdinalCount);
      break;
  }
}